

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionNegativeCornerCaseHelper<long,_unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  long lVar1;
  div_t dVar2;
  div_t dVar3;
  long *in_RDX;
  int in_EDI;
  long minT;
  long maxT;
  unsigned_long_long tmp;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffb0;
  long local_48;
  long local_40;
  long local_38;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_30;
  div_t local_28;
  long *local_20;
  int local_18;
  
  local_20 = in_RDX;
  local_18 = in_EDI;
  lVar1 = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffffb0.m_int);
  dVar2 = division_negative_negateU<long,_unsigned_long_long,_false>::div((int)lVar1,local_18);
  local_28 = dVar2;
  dVar3 = (div_t)std::numeric_limits<long>::max();
  if ((ulong)dVar3 < (ulong)dVar2) {
    local_40 = std::numeric_limits<long>::max();
    if (local_28 != (div_t)(local_40 + 1)) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    local_48 = std::numeric_limits<long>::min();
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)&stack0xffffffffffffffb0,&local_48);
    *local_20 = in_stack_ffffffffffffffb0.m_int;
  }
  else {
    local_38 = ((ulong)local_28 ^ 0xffffffffffffffff) + 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_30,&local_38);
    *local_20 = local_30.m_int;
  }
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }